

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landbasedtracked.cpp
# Opt level: O1

void __thiscall fp::LandBasedTracked::Release(LandBasedTracked *this,string *string)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"LandBasedTracked::Release payload is called\n",0x2c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(string->_M_dataplus)._M_p,string->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void fp::LandBasedTracked::Release(std::string string) {
    std::cerr << "LandBasedTracked::Release payload is called\n" << string << std::endl;
}